

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

Dar_Lib_t * Dar_LibRead(void)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *__ptr;
  Vec_Int_t *vOuts;
  Vec_Int_t *vPrios;
  Dar_Lib_t *p;
  long lVar3;
  
  __ptr = Dar_LibReadNodes();
  vOuts = Dar_LibReadOuts();
  vPrios = Dar_LibReadPrios();
  p = Dar_LibAlloc(__ptr->nSize / 2 + 4);
  if (0 < __ptr->nSize) {
    lVar3 = 0;
    do {
      uVar1 = __ptr->pArray[lVar3];
      uVar2 = __ptr->pArray[lVar3 + 1];
      Dar_LibAddNode(p,(int)uVar1 >> 1,(int)uVar2 >> 1,uVar1 & 1,uVar2 & 1);
      lVar3 = lVar3 + 2;
    } while (lVar3 < __ptr->nSize);
  }
  Dar_LibSetup(p,vOuts,vPrios);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (vOuts->pArray != (int *)0x0) {
    free(vOuts->pArray);
  }
  free(vOuts);
  if (vPrios->pArray != (int *)0x0) {
    free(vPrios->pArray);
  }
  free(vPrios);
  return p;
}

Assistant:

Dar_Lib_t * Dar_LibRead()
{
    Vec_Int_t * vObjs, * vOuts, * vPrios;
    Dar_Lib_t * p;
    int i;
    // read nodes and outputs
    vObjs  = Dar_LibReadNodes();
    vOuts  = Dar_LibReadOuts();
    vPrios = Dar_LibReadPrios();
    // create library
    p = Dar_LibAlloc( Vec_IntSize(vObjs)/2 + 4 );
    // create nodes
    for ( i = 0; i < vObjs->nSize; i += 2 )
        Dar_LibAddNode( p, vObjs->pArray[i] >> 1, vObjs->pArray[i+1] >> 1,
            vObjs->pArray[i] & 1, vObjs->pArray[i+1] & 1 );
    // create outputs
    Dar_LibSetup( p, vOuts, vPrios );
    Vec_IntFree( vObjs );
    Vec_IntFree( vOuts );
    Vec_IntFree( vPrios );
    return p;
}